

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b-ref.c
# Opt level: O1

int blake2b_init_key(blake2b_state *S,uint8_t outlen,void *key,uint8_t keylen)

{
  ulong *puVar1;
  int iVar2;
  uint64_t uVar3;
  long lVar4;
  uint8_t block [128];
  uint8_t local_e8 [200];
  
  iVar2 = -1;
  if ((0xbf < (byte)(outlen + 0xbf)) && (0xbf < (byte)(keylen + 0xbf) && key != (void *)0x0)) {
    local_e8[2] = '\x01';
    local_e8[3] = '\x01';
    local_e8[4] = '\0';
    local_e8[5] = '\0';
    local_e8[6] = '\0';
    local_e8[7] = '\0';
    local_e8[8] = '\0';
    local_e8[9] = '\0';
    local_e8[10] = '\0';
    local_e8[0xb] = '\0';
    local_e8[0xc] = '\0';
    local_e8[0xd] = '\0';
    local_e8[0xe] = '\0';
    local_e8[0xf] = '\0';
    local_e8[0x10] = '\0';
    local_e8[0x11] = '\0';
    local_e8[0x12] = '\0';
    local_e8[0x13] = '\0';
    local_e8[0x14] = '\0';
    local_e8[0x15] = '\0';
    local_e8[0x16] = '\0';
    local_e8[0x17] = '\0';
    local_e8[0x18] = '\0';
    local_e8[0x19] = '\0';
    local_e8[0x1a] = '\0';
    local_e8[0x1b] = '\0';
    local_e8[0x1c] = '\0';
    local_e8[0x1d] = '\0';
    local_e8[0x1e] = '\0';
    local_e8[0x1f] = '\0';
    local_e8[0x20] = '\0';
    local_e8[0x21] = '\0';
    local_e8[0x22] = '\0';
    local_e8[0x23] = '\0';
    local_e8[0x24] = '\0';
    local_e8[0x25] = '\0';
    local_e8[0x26] = '\0';
    local_e8[0x27] = '\0';
    local_e8[0x28] = '\0';
    local_e8[0x29] = '\0';
    local_e8[0x2a] = '\0';
    local_e8[0x2b] = '\0';
    local_e8[0x2c] = '\0';
    local_e8[0x2d] = '\0';
    local_e8[0x2e] = '\0';
    local_e8[0x2f] = '\0';
    local_e8[0x30] = '\0';
    local_e8[0x31] = '\0';
    local_e8[0x32] = '\0';
    local_e8[0x33] = '\0';
    local_e8[0x34] = '\0';
    local_e8[0x35] = '\0';
    local_e8[0x36] = '\0';
    local_e8[0x37] = '\0';
    local_e8[0x38] = '\0';
    local_e8[0x39] = '\0';
    local_e8[0x3a] = '\0';
    local_e8[0x3b] = '\0';
    local_e8[0x3c] = '\0';
    local_e8[0x3d] = '\0';
    local_e8[0x3e] = '\0';
    local_e8[0x3f] = '\0';
    lVar4 = 0;
    local_e8[0] = outlen;
    local_e8[1] = keylen;
    memset(S->t,0,0x140);
    S->h[0] = 0x6a09e667f3bcc908;
    S->h[1] = 0xbb67ae8584caa73b;
    S->h[2] = 0x3c6ef372fe94f82b;
    S->h[3] = 0xa54ff53a5f1d36f1;
    S->h[4] = 0x510e527fade682d1;
    S->h[5] = 0x9b05688c2b3e6c1f;
    S->h[6] = 0x1f83d9abfb41bd6b;
    S->h[7] = 0x5be0cd19137e2179;
    do {
      uVar3 = load64(local_e8 + lVar4);
      puVar1 = (ulong *)((long)S->h + lVar4);
      *puVar1 = *puVar1 ^ uVar3;
      lVar4 = lVar4 + 8;
    } while (lVar4 != 0x40);
    local_e8[0xb0] = '\0';
    local_e8[0xb1] = '\0';
    local_e8[0xb2] = '\0';
    local_e8[0xb3] = '\0';
    local_e8[0xb4] = '\0';
    local_e8[0xb5] = '\0';
    local_e8[0xb6] = '\0';
    local_e8[0xb7] = '\0';
    local_e8[0xb8] = '\0';
    local_e8[0xb9] = '\0';
    local_e8[0xba] = '\0';
    local_e8[0xbb] = '\0';
    local_e8[0xbc] = '\0';
    local_e8[0xbd] = '\0';
    local_e8[0xbe] = '\0';
    local_e8[0xbf] = '\0';
    local_e8[0xa0] = '\0';
    local_e8[0xa1] = '\0';
    local_e8[0xa2] = '\0';
    local_e8[0xa3] = '\0';
    local_e8[0xa4] = '\0';
    local_e8[0xa5] = '\0';
    local_e8[0xa6] = '\0';
    local_e8[0xa7] = '\0';
    local_e8[0xa8] = '\0';
    local_e8[0xa9] = '\0';
    local_e8[0xaa] = '\0';
    local_e8[0xab] = '\0';
    local_e8[0xac] = '\0';
    local_e8[0xad] = '\0';
    local_e8[0xae] = '\0';
    local_e8[0xaf] = '\0';
    local_e8[0x90] = '\0';
    local_e8[0x91] = '\0';
    local_e8[0x92] = '\0';
    local_e8[0x93] = '\0';
    local_e8[0x94] = '\0';
    local_e8[0x95] = '\0';
    local_e8[0x96] = '\0';
    local_e8[0x97] = '\0';
    local_e8[0x98] = '\0';
    local_e8[0x99] = '\0';
    local_e8[0x9a] = '\0';
    local_e8[0x9b] = '\0';
    local_e8[0x9c] = '\0';
    local_e8[0x9d] = '\0';
    local_e8[0x9e] = '\0';
    local_e8[0x9f] = '\0';
    local_e8[0x80] = '\0';
    local_e8[0x81] = '\0';
    local_e8[0x82] = '\0';
    local_e8[0x83] = '\0';
    local_e8[0x84] = '\0';
    local_e8[0x85] = '\0';
    local_e8[0x86] = '\0';
    local_e8[0x87] = '\0';
    local_e8[0x88] = '\0';
    local_e8[0x89] = '\0';
    local_e8[0x8a] = '\0';
    local_e8[0x8b] = '\0';
    local_e8[0x8c] = '\0';
    local_e8[0x8d] = '\0';
    local_e8[0x8e] = '\0';
    local_e8[0x8f] = '\0';
    local_e8[0x70] = '\0';
    local_e8[0x71] = '\0';
    local_e8[0x72] = '\0';
    local_e8[0x73] = '\0';
    local_e8[0x74] = '\0';
    local_e8[0x75] = '\0';
    local_e8[0x76] = '\0';
    local_e8[0x77] = '\0';
    local_e8[0x78] = '\0';
    local_e8[0x79] = '\0';
    local_e8[0x7a] = '\0';
    local_e8[0x7b] = '\0';
    local_e8[0x7c] = '\0';
    local_e8[0x7d] = '\0';
    local_e8[0x7e] = '\0';
    local_e8[0x7f] = '\0';
    local_e8[0x60] = '\0';
    local_e8[0x61] = '\0';
    local_e8[0x62] = '\0';
    local_e8[99] = '\0';
    local_e8[100] = '\0';
    local_e8[0x65] = '\0';
    local_e8[0x66] = '\0';
    local_e8[0x67] = '\0';
    local_e8[0x68] = '\0';
    local_e8[0x69] = '\0';
    local_e8[0x6a] = '\0';
    local_e8[0x6b] = '\0';
    local_e8[0x6c] = '\0';
    local_e8[0x6d] = '\0';
    local_e8[0x6e] = '\0';
    local_e8[0x6f] = '\0';
    local_e8[0x50] = '\0';
    local_e8[0x51] = '\0';
    local_e8[0x52] = '\0';
    local_e8[0x53] = '\0';
    local_e8[0x54] = '\0';
    local_e8[0x55] = '\0';
    local_e8[0x56] = '\0';
    local_e8[0x57] = '\0';
    local_e8[0x58] = '\0';
    local_e8[0x59] = '\0';
    local_e8[0x5a] = '\0';
    local_e8[0x5b] = '\0';
    local_e8[0x5c] = '\0';
    local_e8[0x5d] = '\0';
    local_e8[0x5e] = '\0';
    local_e8[0x5f] = '\0';
    local_e8[0x40] = '\0';
    local_e8[0x41] = '\0';
    local_e8[0x42] = '\0';
    local_e8[0x43] = '\0';
    local_e8[0x44] = '\0';
    local_e8[0x45] = '\0';
    local_e8[0x46] = '\0';
    local_e8[0x47] = '\0';
    local_e8[0x48] = '\0';
    local_e8[0x49] = '\0';
    local_e8[0x4a] = '\0';
    local_e8[0x4b] = '\0';
    local_e8[0x4c] = '\0';
    local_e8[0x4d] = '\0';
    local_e8[0x4e] = '\0';
    local_e8[0x4f] = '\0';
    memcpy(local_e8 + 0x40,key,(ulong)keylen);
    blake2b_update(S,local_e8 + 0x40,0x80);
    lVar4 = 0;
    do {
      local_e8[lVar4 + 0x40] = '\0';
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x80);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int blake2b_init_key( blake2b_state *S, const uint8_t outlen, const void *key, const uint8_t keylen )
{
  blake2b_param P[1];

  if ( ( !outlen ) || ( outlen > BLAKE2B_OUTBYTES ) ) return -1;

  if ( !key || !keylen || keylen > BLAKE2B_KEYBYTES ) return -1;

  P->digest_length = outlen;
  P->key_length    = keylen;
  P->fanout        = 1;
  P->depth         = 1;
  store32( &P->leaf_length, 0 );
  store64( &P->node_offset, 0 );
  P->node_depth    = 0;
  P->inner_length  = 0;
  memset( P->reserved, 0, sizeof( P->reserved ) );
  memset( P->salt,     0, sizeof( P->salt ) );
  memset( P->personal, 0, sizeof( P->personal ) );

  if( blake2b_init_param( S, P ) < 0 ) return -1;

  {
    uint8_t block[BLAKE2B_BLOCKBYTES];
    memset( block, 0, BLAKE2B_BLOCKBYTES );
    memcpy( block, key, keylen );
    blake2b_update( S, block, BLAKE2B_BLOCKBYTES );
    secure_zero_memory( block, BLAKE2B_BLOCKBYTES ); /* Burn the key from stack */
  }
  return 0;
}